

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O1

bool __thiscall Debugger::StopDebugging(Debugger *this,JsRuntimeHandle runtime)

{
  code *pcVar1;
  JsErrorCode JVar2;
  PAL_FILE *pPVar3;
  LPCWSTR pWVar4;
  size_t sVar5;
  Debugger **ppDVar6;
  char16_t *_Format;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  JsValueRef apvStack_2a0 [65];
  JsValueRef pvStack_98;
  AutoRestoreContext AStack_90;
  AutoString AStack_80;
  JsValueRef pvStack_60;
  Debugger *pDStack_58;
  Debugger *local_28;
  void *callbackState;
  
  ppDVar6 = &local_28;
  local_28 = (Debugger *)0x0;
  JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtDiagStopDebugging)(runtime,ppDVar6);
  if (JVar2 != JsNoError) {
    if (JVar2 != JsErrorDiagNotInDebugMode) {
      pPVar3 = PAL_get_stderr(0);
      pWVar4 = Helpers::JsErrorCodeToString(JVar2);
      PAL_fwprintf(pPVar3,L"ERROR: errorCode failed. JsErrorCode=0x%x (%s)\n",(ulong)JVar2,pWVar4);
      pPVar3 = PAL_get_stderr(0);
      PAL_fflush(pPVar3);
    }
    return false;
  }
  if (local_28 == this) {
    this->m_isDetached = true;
    return true;
  }
  StopDebugging();
  pDStack_58 = this;
  AutoRestoreContext::AutoRestoreContext(&AStack_90,((Debugger *)runtime)->m_context);
  JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)(&pvStack_98);
  if (JVar2 == JsNoError) {
    pvStack_60 = (JsValueRef)0x0;
    if (HostConfigFlags::flags.dbgbaselineIsEnabled == true) {
      CallFunction((Debugger *)runtime,"Verify",&pvStack_60,(JsValueRef)0x0,(JsValueRef)0x0);
      JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtConvertValueToNumber)(pvStack_60,apvStack_2a0)
      ;
      if (JVar2 == JsNoError) {
        JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)
                          (apvStack_2a0[0],(int *)&AStack_80);
        bVar8 = JVar2 != JsNoError;
        if (bVar8) {
          pPVar3 = PAL_get_stderr(0);
          Helpers::JsErrorCodeToString(JVar2);
          PAL_fwprintf(pPVar3,
                       L"ERROR: ChakraRTInterface::JsNumberToInt(numberVal, &val) failed. JsErrorCode=0x%x (%s)\n"
                       ,(ulong)JVar2);
          pPVar3 = PAL_get_stderr(0);
          PAL_fflush(pPVar3);
          goto LAB_0010c8d4;
        }
        bVar9 = (int)AStack_80.length == 0;
      }
      else {
        pPVar3 = PAL_get_stderr(0);
        Helpers::JsErrorCodeToString(JVar2);
        PAL_fwprintf(pPVar3,
                     L"ERROR: ChakraRTInterface::JsConvertValueToNumber(result, &numberVal) failed. JsErrorCode=0x%x (%s)\n"
                     ,(ulong)JVar2);
        pPVar3 = PAL_get_stderr(0);
        PAL_fflush(pPVar3);
        bVar8 = true;
LAB_0010c8d4:
        bVar9 = false;
      }
      bVar7 = (bool)(bVar8 ^ 1);
      if ((bVar8 != false) || (bVar9)) goto LAB_0010c960;
    }
    CallFunction((Debugger *)runtime,"GetOutputJson",&pvStack_60,(JsValueRef)0x0,(JsValueRef)0x0);
    AStack_80.data_wide._0_5_ = 0;
    AStack_80._21_8_ = 0;
    AStack_80.length = 0;
    AStack_80.data._0_5_ = 0;
    AStack_80.data._5_3_ = 0;
    JVar2 = AutoString::Initialize(&AStack_80,pvStack_60);
    if (JVar2 == JsNoError) {
      _Format = L"%S.dbg.baseline";
      if (HostConfigFlags::flags.dbgbaselineIsEnabled != false) {
        _Format = L"%S.dbg.baseline.rebase";
      }
      swprintf_s<256ul>((WCHAR (*) [256])apvStack_2a0,_Format,ppDVar6);
      pPVar3 = _wfopen((char16_t *)apvStack_2a0,L"wt");
      if (pPVar3 != (PAL_FILE *)0x0) {
        sVar5 = PAL_fwrite((void *)CONCAT35(AStack_80.data._5_3_,AStack_80.data._0_5_),1,
                           AStack_80.length,pPVar3);
        if ((AStack_80.length & 0xffffffff80000000) != 0) {
          pPVar3 = PAL_get_stderr(0);
          PAL_fprintf(pPVar3,"ASSERTION (%s, line %d) %s %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/Debugger.cpp"
                      ,0x1e7,"baselineData.GetLength() <= 2147483647",
                      "baselineData.GetLength() <= INT_MAX");
          pPVar3 = PAL_get_stderr(0);
          PAL_fflush(pPVar3);
LAB_0010cade:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        if ((int)sVar5 != (int)AStack_80.length) {
          pPVar3 = PAL_get_stderr(0);
          PAL_fprintf(pPVar3,"ASSERTION (%s, line %d) %s %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/Debugger.cpp"
                      ,0x1ea,"false","false");
          pPVar3 = PAL_get_stderr(0);
          PAL_fflush(pPVar3);
          goto LAB_0010cade;
        }
        PAL_fclose(pPVar3);
        if (HostConfigFlags::flags.dbgbaselineIsEnabled == false) {
          PAL_wprintf(L"No baseline file specified, baseline created at \'%s\'\n",apvStack_2a0);
        }
        else {
          Helpers::LogError(L"Rebase file created at \'%s\'\n",apvStack_2a0);
        }
        AutoString::~AutoString(&AStack_80);
        bVar7 = true;
        goto LAB_0010c960;
      }
    }
    else {
      pPVar3 = PAL_get_stderr(0);
      pWVar4 = Helpers::JsErrorCodeToString(JVar2);
      PAL_fwprintf(pPVar3,L"ERROR: baselineData.Initialize(result) failed. JsErrorCode=0x%x (%s)\n",
                   (ulong)JVar2,pWVar4);
      pPVar3 = PAL_get_stderr(0);
      PAL_fflush(pPVar3);
    }
    AutoString::~AutoString(&AStack_80);
  }
  else {
    pPVar3 = PAL_get_stderr(0);
    pWVar4 = Helpers::JsErrorCodeToString(JVar2);
    PAL_fwprintf(pPVar3,
                 L"ERROR: ChakraRTInterface::JsGetUndefinedValue(&undefinedRef) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)JVar2,pWVar4);
    pPVar3 = PAL_get_stderr(0);
    PAL_fflush(pPVar3);
  }
  bVar7 = false;
LAB_0010c960:
  if ((AStack_90.contextChanged == true) && (AStack_90.oldContext != (JsContextRef)0x0)) {
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(AStack_90.oldContext);
  }
  return bVar7;
}

Assistant:

bool Debugger::StopDebugging(JsRuntimeHandle runtime)
{
    void* callbackState = nullptr;

    JsErrorCode errorCode = ChakraRTInterface::JsDiagStopDebugging(runtime, &callbackState);

    if (errorCode == JsErrorCode::JsErrorDiagNotInDebugMode)
    {
        return false;
    }

    IfJsrtErrorFailLogAndRetFalse(errorCode);

    Assert(callbackState == this);

    this->m_isDetached = true;

    return true;
}